

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

CompressionFunction * duckdb::GetCompressionFunction(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_ROARING;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = roaring::RoaringInitAnalyze;
  in_RDI->analyze = roaring::RoaringAnalyze;
  in_RDI->final_analyze = roaring::RoaringFinalAnalyze;
  in_RDI->init_compression = roaring::RoaringInitCompression;
  in_RDI->compress = roaring::RoaringCompress;
  in_RDI->compress_finalize = roaring::RoaringFinalizeCompress;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = roaring::RoaringInitScan;
  in_RDI->scan_vector = roaring::RoaringScan;
  in_RDI->scan_partial = roaring::RoaringScanPartial;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = roaring::RoaringFetchRow;
  in_RDI->skip = roaring::RoaringSkip;
  in_RDI->init_segment = roaring::RoaringInitSegment;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  in_RDI->get_segment_info = (compression_get_segment_info_t)0x0;
  in_RDI->validity = REQUIRES_VALIDITY;
  return in_RDI;
}

Assistant:

CompressionFunction GetCompressionFunction(PhysicalType data_type) {
	return CompressionFunction(CompressionType::COMPRESSION_ROARING, data_type, roaring::RoaringInitAnalyze,
	                           roaring::RoaringAnalyze, roaring::RoaringFinalAnalyze, roaring::RoaringInitCompression,
	                           roaring::RoaringCompress, roaring::RoaringFinalizeCompress, roaring::RoaringInitScan,
	                           roaring::RoaringScan, roaring::RoaringScanPartial, roaring::RoaringFetchRow,
	                           roaring::RoaringSkip, roaring::RoaringInitSegment);
}